

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_node.cc
# Opt level: O2

RC __thiscall QL_Node::IndexToOffset(QL_Node *this,int index,int *offset,int *length)

{
  QL_Manager *pQVar1;
  int *piVar2;
  AttrCatEntry *pAVar3;
  int iVar4;
  int i;
  long lVar5;
  
  *offset = 0;
  pQVar1 = this->qlm;
  piVar2 = this->attrsInRec;
  iVar4 = 0;
  lVar5 = 0;
  while( true ) {
    if (this->attrsInRecSize <= lVar5) {
      return 0x194;
    }
    pAVar3 = pQVar1->attrEntries;
    if (piVar2[lVar5] == index) break;
    iVar4 = iVar4 + pAVar3[piVar2[lVar5]].attrLength;
    *offset = iVar4;
    lVar5 = lVar5 + 1;
  }
  *length = pAVar3[index].attrLength;
  return 0;
}

Assistant:

RC QL_Node::IndexToOffset(int index, int &offset, int &length){
  offset = 0;
  for(int i=0; i < attrsInRecSize; i++){
    if(attrsInRec[i] == index){
      length = qlm.attrEntries[attrsInRec[i]].attrLength;
      return (0);
    }
    offset += qlm.attrEntries[attrsInRec[i]].attrLength;
  }
  return (QL_ATTRNOTFOUND);
}